

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

string * __thiscall
cmComputeLinkInformation::NoCaseExpression_abi_cxx11_
          (string *__return_storage_ptr__,cmComputeLinkInformation *this,char *str)

{
  char cVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  do {
    cVar1 = (char)__return_storage_ptr__;
    if (*str == '.') {
      std::__cxx11::string::push_back(cVar1);
    }
    else {
      if (*str == '\0') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      tolower((int)*str);
      std::__cxx11::string::push_back(cVar1);
      toupper((int)*str);
      std::__cxx11::string::push_back(cVar1);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    str = str + 1;
  } while( true );
}

Assistant:

std::string cmComputeLinkInformation::NoCaseExpression(const char* str)
{
  std::string ret;
  const char* s = str;
  while(*s)
    {
    if(*s == '.')
      {
      ret += *s;
      }
    else
      {
      ret += "[";
      ret += static_cast<char>(tolower(*s));
      ret += static_cast<char>(toupper(*s));
      ret += "]";
      }
    s++;
    }
  return ret;
}